

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

bool IsReachableLoadValue(VmInstruction *user,VmInstruction *load)

{
  VmInstructionType VVar1;
  bool bVar2;
  VmValue **ppVVar3;
  VmConstant *pVVar4;
  VmInstruction *local_38;
  VmInstruction *curr;
  VmConstant *loadAddressConstant;
  VmValue *loadAddress;
  VmInstruction *load_local;
  VmInstruction *user_local;
  
  if (user->parent == load->parent) {
    ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&load->arguments,0);
    pVVar4 = getType<VmConstant>(*ppVVar3);
    for (local_38 = user->prevSibling; local_38 != load; local_38 = local_38->prevSibling) {
      VVar1 = local_38->cmd;
      if (VVar1 - VM_INST_STORE_BYTE < 7) {
        bVar2 = anon_unknown.dwarf_c91b1::IsLoadAliasedWithStore(load,local_38);
        if (bVar2) {
          return false;
        }
      }
      else {
        if (VVar1 - VM_INST_SET_RANGE < 2) {
          return false;
        }
        if (VVar1 == VM_INST_CALL) {
          if (((pVVar4 != (VmConstant *)0x0) && (pVVar4->container != (VariableData *)0x0)) &&
             (bVar2 = HasAddressTaken(pVVar4->container), !bVar2)) {
            return true;
          }
          return false;
        }
      }
    }
    user_local._7_1_ = true;
  }
  else {
    user_local._7_1_ = false;
  }
  return user_local._7_1_;
}

Assistant:

bool IsReachableLoadValue(VmInstruction *user, VmInstruction *load)
{
	if(user->parent != load->parent)
		return false;

	VmValue *loadAddress = load->arguments[0];

	VmConstant *loadAddressConstant = getType<VmConstant>(loadAddress);

	for(VmInstruction *curr = user->prevSibling; curr != load; curr = curr->prevSibling)
	{
		switch(curr->cmd)
		{
		case VM_INST_STORE_BYTE:
		case VM_INST_STORE_SHORT:
		case VM_INST_STORE_INT:
		case VM_INST_STORE_FLOAT:
		case VM_INST_STORE_DOUBLE:
		case VM_INST_STORE_LONG:
		case VM_INST_STORE_STRUCT:
			if(IsLoadAliasedWithStore(load, curr))
				return false;
			break;
		case VM_INST_SET_RANGE:
		case VM_INST_MEM_COPY:
			return false;
		case VM_INST_CALL:
			if(loadAddressConstant && loadAddressConstant->container && !HasAddressTaken(loadAddressConstant->container))
				return true;

			return false;
		default:
			break;
		}
	}

	return true;
}